

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::temp_directory_path(void)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  path *in_RDI;
  error_code ec_00;
  string local_48;
  undefined1 local_21;
  undefined1 auStack_20 [8];
  error_code ec;
  path *result;
  
  std::error_code::error_code((error_code *)auStack_20);
  local_21 = 0;
  temp_directory_path(in_RDI,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (bVar1) {
    this = (filesystem_error *)__cxa_allocate_exception(0x90);
    code = std::error_code::value((error_code *)auStack_20);
    detail::systemErrorText<int>(&local_48,code);
    ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
    ec_00._M_cat = (error_category *)ec._0_8_;
    filesystem_error::filesystem_error(this,&local_48,ec_00);
    __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path temp_directory_path()
{
    std::error_code ec;
    path result = temp_directory_path(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}